

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O1

void __thiscall leveldb::TableBuilder::~TableBuilder(TableBuilder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  FilterBlockBuilder *pFVar3;
  pointer puVar4;
  pointer pSVar5;
  pointer pcVar6;
  pointer puVar7;
  Rep *this_00;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->rep_->closed == false) {
    __assert_fail("rep_->closed",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/table_builder.cc"
                  ,0x49,"leveldb::TableBuilder::~TableBuilder()");
  }
  pFVar3 = this->rep_->filter_block;
  if (pFVar3 != (FilterBlockBuilder *)0x0) {
    puVar4 = (pFVar3->filter_offsets_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4,(long)(pFVar3->filter_offsets_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4)
      ;
    }
    pSVar5 = (pFVar3->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar5 != (pointer)0x0) {
      operator_delete(pSVar5,(long)(pFVar3->tmp_keys_).
                                   super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar5
                     );
    }
    pcVar6 = (pFVar3->result_)._M_dataplus._M_p;
    paVar1 = &(pFVar3->result_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != paVar1) {
      operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
    }
    puVar7 = (pFVar3->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar7 != (pointer)0x0) {
      operator_delete(puVar7,(long)(pFVar3->start_).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7
                     );
    }
    pcVar6 = (pFVar3->keys_)._M_dataplus._M_p;
    paVar1 = &(pFVar3->keys_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != paVar1) {
      operator_delete(pcVar6,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pFVar3,0x90);
  }
  this_00 = this->rep_;
  if (this_00 == (Rep *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return;
    }
  }
  else {
    Rep::~Rep(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      operator_delete(this_00,0x218);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

TableBuilder::~TableBuilder() {
  assert(rep_->closed);  // Catch errors where caller forgot to call Finish()
  delete rep_->filter_block;
  delete rep_;
}